

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestNamer.cpp
# Opt level: O2

string * __thiscall
CppUnit::TestNamer::getTestNameFor
          (string *__return_storage_ptr__,TestNamer *this,string *testMethodName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*this->_vptr_TestNamer[2])(&local_38);
  std::operator+(&bStack_58,&local_38,"::");
  std::operator+(__return_storage_ptr__,&bStack_58,testMethodName);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string 
TestNamer::getTestNameFor( const std::string &testMethodName ) const
{
  return getFixtureName() + "::" + testMethodName;
}